

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O1

Point __thiscall TextBuffer::Layer::position_for_offset(Layer *this,uint32_t goal_offset)

{
  Point PVar1;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  if ((this->text).is_some == true) {
    PVar1 = Text::position_for_offset(&(this->text).value,goal_offset,0,true);
    return PVar1;
  }
  local_28._8_8_ = 0;
  pcStack_10 = std::
               _Function_handler<unsigned_int_(Point),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/superstring/src/core/text-buffer.cc:215:9)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<unsigned_int_(Point),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/superstring/src/core/text-buffer.cc:215:9)>
             ::_M_manager;
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<Point_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/superstring/src/core/text-buffer.cc:218:9)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<Point_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/superstring/src/core/text-buffer.cc:218:9)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  local_28._M_unused._M_object = this;
  PVar1 = Patch::new_position_for_new_offset
                    (&this->patch,goal_offset,(function<unsigned_int_(Point)> *)&local_28,
                     (function<Point_(unsigned_int)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return PVar1;
}

Assistant:

Point position_for_offset(uint32_t goal_offset) const {
    if (text) {
      return text->position_for_offset(goal_offset);
    } else {
      return patch.new_position_for_new_offset(
        goal_offset,
        [this](Point old_position) {
          return previous_layer->clip_position(old_position).offset;
        },
        [this](uint32_t old_offset) {
          return previous_layer->position_for_offset(old_offset);
        }
      );
    }
  }